

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Register.cpp
# Opt level: O3

void OpenMD::registerIntegrators(void)

{
  IntegratorFactory *pIVar1;
  IntegratorCreator *pIVar2;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"NVE","");
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7650;
  (pIVar2->ident_)._M_dataplus._M_p = (pointer)&(pIVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pIVar2->ident_,local_50,local_48 + (long)local_50);
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7600;
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"NVT","");
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7650;
  (pIVar2->ident_)._M_dataplus._M_p = (pointer)&(pIVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pIVar2->ident_,local_50,local_48 + (long)local_50);
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7678;
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"NPTI","");
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7650;
  (pIVar2->ident_)._M_dataplus._M_p = (pointer)&(pIVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pIVar2->ident_,local_50,local_48 + (long)local_50);
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f76b8;
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"NPTF","");
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7650;
  (pIVar2->ident_)._M_dataplus._M_p = (pointer)&(pIVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pIVar2->ident_,local_50,local_48 + (long)local_50);
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f76f8;
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"NPTXYZ","");
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7650;
  (pIVar2->ident_)._M_dataplus._M_p = (pointer)&(pIVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pIVar2->ident_,local_50,local_48 + (long)local_50);
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7738;
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"NPAT","");
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7650;
  (pIVar2->ident_)._M_dataplus._M_p = (pointer)&(pIVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pIVar2->ident_,local_50,local_48 + (long)local_50);
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7778;
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"NPA","");
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7650;
  (pIVar2->ident_)._M_dataplus._M_p = (pointer)&(pIVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pIVar2->ident_,local_50,local_48 + (long)local_50);
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f77b8;
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"NPRT","");
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7650;
  (pIVar2->ident_)._M_dataplus._M_p = (pointer)&(pIVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pIVar2->ident_,local_50,local_48 + (long)local_50);
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f77f8;
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"NPGT","");
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7650;
  (pIVar2->ident_)._M_dataplus._M_p = (pointer)&(pIVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pIVar2->ident_,local_50,local_48 + (long)local_50);
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f77f8;
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"NGT","");
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7650;
  (pIVar2->ident_)._M_dataplus._M_p = (pointer)&(pIVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pIVar2->ident_,local_50,local_48 + (long)local_50);
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7838;
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"NGAMMAT","");
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7650;
  (pIVar2->ident_)._M_dataplus._M_p = (pointer)&(pIVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pIVar2->ident_,local_50,local_48 + (long)local_50);
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7838;
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"LANGEVINDYNAMICS","");
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7650;
  (pIVar2->ident_)._M_dataplus._M_p = (pointer)&(pIVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pIVar2->ident_,local_50,local_48 + (long)local_50);
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7878;
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"LD","");
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7650;
  (pIVar2->ident_)._M_dataplus._M_p = (pointer)&(pIVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pIVar2->ident_,local_50,local_48 + (long)local_50);
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7878;
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"LHULL","");
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7650;
  (pIVar2->ident_)._M_dataplus._M_p = (pointer)&(pIVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pIVar2->ident_,local_50,local_48 + (long)local_50);
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7878;
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"LANGEVINHULL","");
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7650;
  (pIVar2->ident_)._M_dataplus._M_p = (pointer)&(pIVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pIVar2->ident_,local_50,local_48 + (long)local_50);
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7878;
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"SMIPD","");
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7650;
  (pIVar2->ident_)._M_dataplus._M_p = (pointer)&(pIVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pIVar2->ident_,local_50,local_48 + (long)local_50);
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7878;
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pIVar1 = IntegratorFactory::getInstance();
  pIVar2 = (IntegratorCreator *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"LANGEVINPISTON","");
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f7650;
  (pIVar2->ident_)._M_dataplus._M_p = (pointer)&(pIVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pIVar2->ident_,local_50,local_48 + (long)local_50);
  pIVar2->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002f78b8;
  IntegratorFactory::registerIntegrator(pIVar1,pIVar2);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void registerIntegrators() {
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NVE>("NVE"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NVT>("NVT"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NPTi>("NPTI"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NPTf>("NPTF"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NPTxyz>("NPTXYZ"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NPAT>("NPAT"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NPA>("NPA"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NPrT>("NPRT"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NPrT>("NPGT"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NgammaT>("NGT"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<NgammaT>("NGAMMAT"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<LangevinDynamics>("LANGEVINDYNAMICS"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<LangevinDynamics>("LD"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<LangevinDynamics>("LHULL"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<LangevinDynamics>("LANGEVINHULL"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<LangevinDynamics>("SMIPD"));
    IntegratorFactory::getInstance().registerIntegrator(
        new IntegratorBuilder<LangevinPiston>("LANGEVINPISTON"));
  }